

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_BnB_Node.h
# Opt level: O1

Index __thiscall BGIP_BnB_Node::GetSpecifiedAction(BGIP_BnB_Node *this,Index agI,Index depth_tI)

{
  ostream *poVar1;
  undefined8 *puVar2;
  E *this_00;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  while( true ) {
    if (this->_m_depth == depth_tI) {
      return (this->_m_specifiedActions).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[agI];
    }
    if (this->_m_depth <= depth_tI) break;
    this = (this->_m_parent).px;
    if (this == (element_type *)0x0) {
      std::__cxx11::stringstream::stringstream(asStack_198);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_188,"asking parent value, but this node (at depth/that specifies ",0x3c);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_188);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1," joint actions (for as many joint types) ) has no parent!",0x39);
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
      *puVar2 = &PTR__E_0059bd80;
      std::__cxx11::stringbuf::str();
      __cxa_throw(puVar2,&E::typeinfo,E::~E);
    }
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"Error asking node for action at a deeper level!");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

Index GetSpecifiedAction(Index agI, Index depth_tI) const
    { 
        size_t d = this->GetDepth();
        if( depth_tI == d )
            return _m_specifiedActions[agI];
        else if (depth_tI < d)
        {
            if(_m_parent == 0)
            {
                std::stringstream ss;
                ss << "asking parent value, but this node (at depth/that specifies "<<_m_depth<<" joint actions (for as many joint types) ) has no parent!";
                throw E(ss);
            }
            return _m_parent->GetSpecifiedAction(agI, depth_tI);
        }
        else
            throw E("Error asking node for action at a deeper level!");
    }